

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

bool isEntryInIanaList(QByteArrayView id,QByteArrayView ianaIds)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  qsizetype cut;
  QByteArrayView *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  char in_stack_ffffffffffffffa7;
  QByteArrayView *this;
  bool local_49;
  QByteArrayView in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
  do {
    this = (QByteArrayView *)
           QByteArrayView::indexOf
                     (this,in_stack_ffffffffffffffa7,(qsizetype)in_stack_ffffffffffffff98);
    if ((long)this < 0) {
      local_49 = operator==((QByteArrayView *)
                            CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98);
LAB_0073c4d3:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_49;
      }
      __stack_chk_fail();
    }
    QByteArrayView::first(in_stack_ffffffffffffff98,0x73c462);
    bVar2 = operator==((QByteArrayView *)
                       CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    if (bVar2) {
      local_49 = true;
      goto LAB_0073c4d3;
    }
    in_stack_ffffffffffffffb8 =
         QByteArrayView::sliced
                   ((QByteArrayView *)in_stack_ffffffffffffffb8.m_data,
                    in_stack_ffffffffffffffb8.m_size);
  } while( true );
}

Assistant:

static bool isEntryInIanaList(QByteArrayView id, QByteArrayView ianaIds)
{
    qsizetype cut;
    while ((cut = ianaIds.indexOf(' ')) >= 0) {
        if (id == ianaIds.first(cut))
            return true;
        ianaIds = ianaIds.sliced(cut + 1);
    }
    return id == ianaIds;
}